

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicGLSLMiscFS::Run(BasicGLSLMiscFS *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  _Alloc_hider _Var1;
  bool bVar2;
  byte bVar3;
  GLuint GVar4;
  void *__s;
  void *__s_00;
  int *piVar5;
  Vector<int,_4> *extraout_RDX;
  Vector<int,_4> *v;
  Vector<int,_4> *extraout_RDX_00;
  Vector<int,_4> *extraout_RDX_01;
  Vector<int,_4> *extraout_RDX_02;
  Vector<int,_4> *v_00;
  long lVar6;
  value_type_conflict2 *__val;
  ulong uVar7;
  string local_98;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar2 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,2);
  lVar6 = 0x10;
  if (bVar2) {
    bVar2 = ShaderImageLoadStoreBase::IsSSBInVSFSAvailable(&this->super_ShaderImageLoadStoreBase,1);
    if (bVar2) {
      __s = operator_new(0x4000);
      this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      textures = &this->m_texture;
      memset(__s,0,0x4000);
      glu::CallLogWrapper::glGenTextures(this_00,1,textures);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,*textures);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage3D(this_00,0x8c1a,1,0x822e,0x20,0x20,4);
      glu::CallLogWrapper::glTexSubImage3D(this_00,0x8c1a,0,0,0,0,0x20,0x20,4,0x1903,0x1406,__s);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
      GVar4 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,
                         "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                         ,
                         "\n#define KSIZE 32\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE*KSIZE];\n};\nlayout(r32f, binding = 0) coherent restrict uniform image2D g_image_layer0;\nlayout(r32f, binding = 1) volatile uniform image2D g_image_layer1;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_layer0, coord, vec4(1.0));\n  memoryBarrier();\n  imageStore(g_image_layer1, coord, vec4(2.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(3.0));\n  memoryBarrier();\n  int coordIndex = coord.x + KSIZE * coord.y;\n  o_color[coordIndex] = ivec4(imageLoad(g_image_layer0, coord) + imageLoad(g_image_layer1, coord));\n}"
                         ,false,false);
      this->m_program = GVar4;
      ShaderImageLoadStoreBase::CreateFullViewportQuad
                (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x822e);
      glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,0,'\0',1,0x88ba,0x822e);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glViewport(this_00,0,0,0x20,0x20);
      __s_00 = operator_new(0x4000);
      memset(__s_00,0,0x4000);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x4000,__s_00,0x88e4);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      piVar5 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x4000,1);
      bVar3 = 1;
      uVar7 = 0;
      v_00 = extraout_RDX;
      do {
        if ((((*piVar5 != 5) || (piVar5[1] != 0)) || (piVar5[2] != 0)) || (piVar5[3] != 2)) {
          local_48 = *(undefined8 *)piVar5;
          uStack_40 = *(undefined8 *)(piVar5 + 2);
          glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                    (&local_78,(ShaderImageLoadStoreBase *)&local_48,v_00);
          _Var1._M_p = local_78._M_dataplus._M_p;
          local_58 = 5;
          uStack_50 = 0x200000000;
          glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                    (&local_98,(ShaderImageLoadStoreBase *)&local_58,v);
          anon_unknown_0::Output
                    ("[%d] Check failed. Received: %s instead of: %s \n",uVar7 & 0xffffffff,
                     _Var1._M_p,local_98._M_dataplus._M_p);
          v_00 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            v_00 = extraout_RDX_01;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            v_00 = extraout_RDX_02;
          }
          bVar3 = 0;
        }
        uVar7 = uVar7 + 1;
        piVar5 = piVar5 + 4;
      } while (uVar7 != 0x400);
      lVar6 = -(ulong)(~bVar3 & 1);
      operator_delete(__s_00,0x4000);
      operator_delete(__s,0x4000);
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 2) || !IsSSBInVSFSAvailable(1))
			return NOT_SUPPORTED;

		const int		   kSize = 32;
		std::vector<float> data(kSize * kSize * 4);

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_R32F, kSize, kSize, 4);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, kSize, kSize, 4, GL_RED, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* src_fs =
			NL "#define KSIZE 32" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE*KSIZE];" NL "};" NL
			   "layout(r32f, binding = 0) coherent restrict uniform image2D g_image_layer0;" NL
			   "layout(r32f, binding = 1) volatile uniform image2D g_image_layer1;" NL "void main() {" NL
			   "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image_layer0, coord, vec4(1.0));" NL
			   "  memoryBarrier();" NL "  imageStore(g_image_layer1, coord, vec4(2.0));" NL "  memoryBarrier();" NL
			   "  imageStore(g_image_layer0, coord, vec4(3.0));" NL "  memoryBarrier();" NL
			   "  int coordIndex = coord.x + KSIZE * coord.y;" NL
			   "  o_color[coordIndex] = ivec4(imageLoad(g_image_layer0, coord) + imageLoad(g_image_layer1, coord));" NL
			   "}";
		m_program = BuildProgram(src_vs, src_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 1, GL_READ_WRITE, GL_R32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, kSize, kSize);

		std::vector<ivec4> o_data(kSize * kSize);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &o_data[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;

		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(5, 0, 0, 2), 0))
			{
				status = false;
				Output("[%d] Check failed. Received: %s instead of: %s \n", i, ToString(out_data[i]).c_str(),
					   ToString(ivec4(5, 0, 0, 2)).c_str());
			}
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}